

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# y4m_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1b2a1e7::Y4mVideoWriteTest_WriteTest_Test::TestBody
          (Y4mVideoWriteTest_WriteTest_Test *this)

{
  uint bit_depth;
  aom_img_fmt_t fmt;
  char *pcVar1;
  ParamType *pPVar2;
  allocator local_49;
  string local_48;
  
  pPVar2 = testing::WithParamInterface<(anonymous_namespace)::Y4mTestParam>::GetParam();
  bit_depth = pPVar2->bit_depth;
  fmt = pPVar2->format;
  pcVar1 = pPVar2->md5raw;
  std::__cxx11::string::string((string *)&local_48,pPVar2->filename,&local_49);
  (*(this->super_Y4mVideoWriteTest).super_Y4mVideoSourceTest.
    super_TestWithParam<(anonymous_namespace)::Y4mTestParam>.super_Test._vptr_Test[6])
            (this,&local_48,10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  Y4mVideoSourceTest::HeaderChecks((Y4mVideoSourceTest *)this,bit_depth,fmt);
  std::__cxx11::string::string((string *)&local_48,pcVar1,&local_49);
  Y4mVideoSourceTest::Md5Check((Y4mVideoSourceTest *)this,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST_P(Y4mVideoWriteTest, WriteTest) {
  const Y4mTestParam t = GetParam();
  Init(t.filename, kFrames);
  HeaderChecks(t.bit_depth, t.format);
  Md5Check(t.md5raw);
}